

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O3

void Hop_TableProfile(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = p->nTableSize;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      pHVar2 = p->pTable[lVar4];
      if (pHVar2 != (Hop_Obj_t *)0x0) {
        uVar3 = 0;
        do {
          uVar3 = (ulong)((int)uVar3 + 1);
          pHVar2 = (pHVar2->field_1).pNext;
        } while (pHVar2 != (Hop_Obj_t *)0x0);
        printf("%d ",uVar3);
        iVar1 = p->nTableSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

void Hop_TableProfile( Hop_Man_t * p )
{
    Hop_Obj_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}